

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

float __thiscall QString::toFloat(QString *this,bool *ok)

{
  float fVar1;
  double d;
  
  d = toDouble(this,ok);
  fVar1 = QLocaleData::convertDoubleToFloat(d,ok);
  return fVar1;
}

Assistant:

float QString::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}